

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Print
          (TextGenerator *this,char *text,size_t size)

{
  size_t sVar1;
  long lVar2;
  
  if (size == 0) {
    lVar2 = 0;
  }
  else {
    sVar1 = 0;
    lVar2 = 0;
    do {
      if (text[sVar1] == '\n') {
        Write(this,text + lVar2,(sVar1 - lVar2) + 1);
        lVar2 = sVar1 + 1;
        this->at_start_of_line_ = true;
      }
      sVar1 = sVar1 + 1;
    } while (sVar1 != size);
  }
  Write(this,text + lVar2,size - lVar2);
  return;
}

Assistant:

void Print(const char* text, size_t size) {
    size_t pos = 0;  // The number of bytes we've written so far.

    for (size_t i = 0; i < size; i++) {
      if (text[i] == '\n') {
        // Saw newline.  If there is more text, we may need to insert an indent
        // here.  So, write what we have so far, including the '\n'.
        Write(text + pos, i - pos + 1);
        pos = i + 1;

        // Setting this true will cause the next Write() to insert an indent
        // first.
        at_start_of_line_ = true;
      }
    }

    // Write the rest.
    Write(text + pos, size - pos);
  }